

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O0

CURLcode Curl_rtsp_parseheader(Curl_easy *data,char *header)

{
  int iVar1;
  CURLcode CVar2;
  size_t length;
  size_t sVar3;
  void *pvVar4;
  bool bVar5;
  CURLcode result;
  size_t idlen;
  char *end;
  char *start;
  RTSP *rtsp;
  char *p;
  char *endp;
  long CSeq;
  char *header_local;
  Curl_easy *data_local;
  
  CSeq = (long)header;
  header_local = (char *)data;
  iVar1 = curl_strnequal(header,"CSeq:",5);
  if (iVar1 == 0) {
    iVar1 = curl_strnequal((char *)CSeq,"Session:",8);
    if (iVar1 == 0) {
      iVar1 = curl_strnequal((char *)CSeq,"Transport:",10);
      if ((iVar1 != 0) &&
         (CVar2 = rtsp_parse_transport((Curl_easy *)header_local,(char *)(CSeq + 10)),
         CVar2 != CURLE_OK)) {
        return CVar2;
      }
    }
    else {
      end = (char *)(CSeq + 8);
      while( true ) {
        bVar5 = false;
        if ((*end != '\0') && (bVar5 = true, *end != ' ')) {
          bVar5 = *end == '\t';
        }
        if (!bVar5) break;
        end = end + 1;
      }
      if (*end == '\0') {
        Curl_failf((Curl_easy *)header_local,"Got a blank Session ID");
        return CURLE_RTSP_SESSION_ERROR;
      }
      idlen = (size_t)end;
      while( true ) {
        bVar5 = false;
        if ((*(char *)idlen != '\0') && (bVar5 = false, *(char *)idlen != ';')) {
          bVar5 = true;
          if ((*(char *)idlen != ' ') &&
             ((bVar5 = true, *(char *)idlen != '\t' && (bVar5 = false, '\t' < *(char *)idlen)))) {
            bVar5 = *(char *)idlen < '\x0e';
          }
          bVar5 = (bool)(bVar5 ^ 1);
        }
        if (!bVar5) break;
        idlen = idlen + 1;
      }
      length = idlen - (long)end;
      if (*(long *)(header_local + 0x8e8) == 0) {
        pvVar4 = Curl_memdup0(end,length);
        *(void **)(header_local + 0x8e8) = pvVar4;
        if (*(long *)(header_local + 0x8e8) == 0) {
          return CURLE_OUT_OF_MEMORY;
        }
      }
      else {
        sVar3 = strlen(*(char **)(header_local + 0x8e8));
        if ((sVar3 != length) ||
           (iVar1 = strncmp(end,*(char **)(header_local + 0x8e8),length), iVar1 != 0)) {
          Curl_failf((Curl_easy *)header_local,"Got RTSP Session ID Line [%s], but wanted ID [%s]",
                     end,*(undefined8 *)(header_local + 0x8e8));
          return CURLE_RTSP_SESSION_ERROR;
        }
      }
    }
  }
  else {
    endp = (char *)0x0;
    rtsp = (RTSP *)(CSeq + 5);
    while( true ) {
      bVar5 = true;
      if ((char)rtsp->CSeq_sent != ' ') {
        bVar5 = (char)rtsp->CSeq_sent == '\t';
      }
      if (!bVar5) break;
      rtsp = (RTSP *)((long)&rtsp->CSeq_sent + 1);
    }
    endp = (char *)strtol((char *)rtsp,&p,10);
    if (rtsp == (RTSP *)p) {
      Curl_failf((Curl_easy *)header_local,"Unable to read the CSeq header: [%s]",CSeq);
      return CURLE_RTSP_CSEQ_ERROR;
    }
    *(char **)(*(long *)(header_local + 0x1b8) + 8) = endp;
    *(char **)(header_local + 0x11b0) = endp;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_rtsp_parseheader(struct Curl_easy *data, const char *header)
{
  if(checkprefix("CSeq:", header)) {
    long CSeq = 0;
    char *endp;
    const char *p = &header[5];
    while(ISBLANK(*p))
      p++;
    CSeq = strtol(p, &endp, 10);
    if(p != endp) {
      struct RTSP *rtsp = data->req.p.rtsp;
      rtsp->CSeq_recv = CSeq; /* mark the request */
      data->state.rtsp_CSeq_recv = CSeq; /* update the handle */
    }
    else {
      failf(data, "Unable to read the CSeq header: [%s]", header);
      return CURLE_RTSP_CSEQ_ERROR;
    }
  }
  else if(checkprefix("Session:", header)) {
    const char *start, *end;
    size_t idlen;

    /* Find the first non-space letter */
    start = header + 8;
    while(*start && ISBLANK(*start))
      start++;

    if(!*start) {
      failf(data, "Got a blank Session ID");
      return CURLE_RTSP_SESSION_ERROR;
    }

    /* Find the end of Session ID
     *
     * Allow any non whitespace content, up to the field separator or end of
     * line. RFC 2326 is not 100% clear on the session ID and for example
     * gstreamer does url-encoded session ID's not covered by the standard.
     */
    end = start;
    while(*end && *end != ';' && !ISSPACE(*end))
      end++;
    idlen = end - start;

    if(data->set.str[STRING_RTSP_SESSION_ID]) {

      /* If the Session ID is set, then compare */
      if(strlen(data->set.str[STRING_RTSP_SESSION_ID]) != idlen ||
         strncmp(start, data->set.str[STRING_RTSP_SESSION_ID], idlen)) {
        failf(data, "Got RTSP Session ID Line [%s], but wanted ID [%s]",
              start, data->set.str[STRING_RTSP_SESSION_ID]);
        return CURLE_RTSP_SESSION_ERROR;
      }
    }
    else {
      /* If the Session ID is not set, and we find it in a response, then set
       * it.
       */

      /* Copy the id substring into a new buffer */
      data->set.str[STRING_RTSP_SESSION_ID] = Curl_memdup0(start, idlen);
      if(!data->set.str[STRING_RTSP_SESSION_ID])
        return CURLE_OUT_OF_MEMORY;
    }
  }
  else if(checkprefix("Transport:", header)) {
    CURLcode result;
    result = rtsp_parse_transport(data, header + 10);
    if(result)
      return result;
  }
  return CURLE_OK;
}